

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O0

void framebuffer_size_callback(GLFWwindow *window,int width,int height)

{
  float local_68 [2];
  mat4x4 projection;
  float local_1c;
  float ratio;
  int height_local;
  int width_local;
  GLFWwindow *window_local;
  
  local_1c = 1.0;
  if (0 < height) {
    local_1c = (float)width / (float)height;
  }
  (*glad_glViewport)(0,0,width,height);
  (*glad_glMatrixMode)(0x1701);
  mat4x4_perspective((vec4 *)local_68,1.0471976,local_1c,1.0,1024.0);
  (*glad_glLoadMatrixf)(local_68);
  return;
}

Assistant:

void framebuffer_size_callback(GLFWwindow* window, int width, int height)
{
    float ratio = 1.f;
    mat4x4 projection;

    if (height > 0)
        ratio = (float) width / (float) height;

    // Setup viewport
    glViewport(0, 0, width, height);

    // Change to the projection matrix and set our viewing volume
    glMatrixMode(GL_PROJECTION);
    mat4x4_perspective(projection,
                       60.f * (float) M_PI / 180.f,
                       ratio,
                       1.f, 1024.f);
    glLoadMatrixf((const GLfloat*) projection);
}